

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O0

_Bool upb_Clone_MessageValue(void *value,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  void *__src;
  _Bool empty;
  int iVar1;
  char *data;
  upb_Message *puVar2;
  uintptr_t uVar3;
  upb_StringView uVar4;
  upb_Message *clone;
  _Bool is_empty;
  upb_TaggedMessagePtr source_1;
  size_t local_58;
  void *cloned_data;
  int size;
  upb_StringView source;
  upb_Arena *arena_local;
  upb_MiniTable *sub_local;
  upb_CType value_type_local;
  void *value_local;
  
  if (4 < value_type - kUpb_CType_Bool) {
    if (value_type == kUpb_CType_Message) {
      uVar3 = *value;
      empty = upb_TaggedMessagePtr_IsEmpty(uVar3);
      arena_local = (upb_Arena *)sub;
      if (empty) {
        arena_local = (upb_Arena *)_upb_MiniTable_Empty_dont_copy_me__upb_internal_use_only();
      }
      if (uVar3 != 0) {
        puVar2 = _upb_TaggedMessagePtr_GetMessage_dont_copy_me__upb_internal_use_only(uVar3);
        puVar2 = upb_Message_DeepClone(puVar2,(upb_MiniTable *)arena_local,arena);
        uVar3 = _upb_TaggedMessagePtr_Pack_dont_copy_me__upb_internal_use_only(puVar2,empty);
        *(uintptr_t *)value = uVar3;
        return puVar2 != (upb_Message *)0x0;
      }
      __assert_fail("source",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                    ,0x4e,
                    "_Bool upb_Clone_MessageValue(void *, upb_CType, const upb_MiniTable *, upb_Arena *)"
                   );
    }
    if (2 < value_type - kUpb_CType_Double) {
      if (1 < value_type - kUpb_CType_String) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                      ,0x56,
                      "_Bool upb_Clone_MessageValue(void *, upb_CType, const upb_MiniTable *, upb_Arena *)"
                     );
      }
      __src = *value;
      iVar1 = (int)*(undefined8 *)((long)value + 8);
      data = (char *)upb_Arena_Malloc(arena,(long)iVar1);
      if (data == (char *)0x0) {
        return false;
      }
      uVar4 = upb_StringView_FromDataAndSize(data,(long)iVar1);
      source_1 = (upb_TaggedMessagePtr)uVar4.data;
      *(upb_TaggedMessagePtr *)value = source_1;
      local_58 = uVar4.size;
      *(size_t *)((long)value + 8) = local_58;
      memcpy(data,__src,(long)iVar1);
      return true;
    }
  }
  return true;
}

Assistant:

static bool upb_Clone_MessageValue(void* value, upb_CType value_type,
                                   const upb_MiniTable* sub, upb_Arena* arena) {
  switch (value_type) {
    case kUpb_CType_Bool:
    case kUpb_CType_Float:
    case kUpb_CType_Int32:
    case kUpb_CType_UInt32:
    case kUpb_CType_Enum:
    case kUpb_CType_Double:
    case kUpb_CType_Int64:
    case kUpb_CType_UInt64:
      return true;
    case kUpb_CType_String:
    case kUpb_CType_Bytes: {
      upb_StringView source = *(upb_StringView*)value;
      int size = source.size;
      void* cloned_data = upb_Arena_Malloc(arena, size);
      if (cloned_data == NULL) {
        return false;
      }
      *(upb_StringView*)value =
          upb_StringView_FromDataAndSize(cloned_data, size);
      memcpy(cloned_data, source.data, size);
      return true;
    } break;
    case kUpb_CType_Message: {
      const upb_TaggedMessagePtr source = *(upb_TaggedMessagePtr*)value;
      bool is_empty = upb_TaggedMessagePtr_IsEmpty(source);
      if (is_empty) sub = UPB_PRIVATE(_upb_MiniTable_Empty)();
      UPB_ASSERT(source);
      upb_Message* clone = upb_Message_DeepClone(
          UPB_PRIVATE(_upb_TaggedMessagePtr_GetMessage)(source), sub, arena);
      *(upb_TaggedMessagePtr*)value =
          UPB_PRIVATE(_upb_TaggedMessagePtr_Pack)(clone, is_empty);
      return clone != NULL;
    } break;
  }
  UPB_UNREACHABLE();
}